

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O0

void __thiscall Gecko::Graph::Graph(Graph *this,uint nodes,uint level)

{
  uint in_EDX;
  uint in_ESI;
  Graph *in_RDI;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12b079);
  std::vector<Gecko::Node,_std::allocator<Gecko::Node>_>::vector
            ((vector<Gecko::Node,_std::allocator<Gecko::Node>_> *)0x12b08c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x12b0a1);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x12b0b6);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x12b0cb);
  in_RDI->level = in_EDX;
  in_RDI->last_node = 0;
  init(in_RDI,(EVP_PKEY_CTX *)(ulong)in_ESI);
  return;
}

Assistant:

Graph(uint nodes, uint level) : level(level), last_node(Node::null) { init(nodes); }